

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::internal::DecodeIpv6AddressList
                  (Error *__return_storage_ptr__,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *aAddrs,ByteArray *aBuf)

{
  long lVar1;
  ByteArray *this;
  bool bVar2;
  uchar *puVar3;
  uchar *puVar4;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar5;
  string_view fmt;
  format_args args;
  int local_1dc;
  string local_1d8;
  ErrorCode local_1b4;
  Error local_1b0;
  allocator<unsigned_char> local_181;
  ByteArray local_180;
  ByteArray *local_168;
  ByteArray *value;
  Address addr;
  anon_class_1_0_00000001 local_132;
  v10 local_131;
  v10 *local_130;
  size_t local_128;
  string local_120;
  Error local_100;
  ulong local_d8;
  size_t offset;
  size_t length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  ByteArray *aBuf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *aAddrs_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  length._7_1_ = 0;
  local_c0 = aBuf;
  aBuf_local = (ByteArray *)aAddrs;
  aAddrs_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  offset = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_c0);
  local_d8 = 0;
  do {
    if (offset <= local_d8) goto LAB_0027ef7d;
    if (offset < local_d8 + 0x10) {
      DecodeIpv6AddressList::anon_class_1_0_00000001::operator()(&local_132);
      local_58 = &local_130;
      local_60 = &local_131;
      bVar5 = ::fmt::v10::operator()(local_60);
      local_128 = bVar5.size_;
      local_130 = (v10 *)bVar5.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_68 = &local_120;
      local_78 = local_130;
      sStack_70 = local_128;
      local_50 = &local_78;
      local_88 = local_130;
      local_80 = local_128;
      local_48 = local_88;
      sStack_40 = local_80;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_30 = local_98;
      local_38 = &error;
      local_20 = 0;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_80;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_120,local_88,fmt,args);
      Error::Error(&local_100,kBadFormat,&local_120);
      Error::operator=(__return_storage_ptr__,&local_100);
      Error::~Error(&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      goto LAB_0027ef7d;
    }
    Address::Address((Address *)&value);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    puVar3 = puVar3 + local_d8;
    puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_c0);
    lVar1 = local_d8 + 0x10;
    std::allocator<unsigned_char>::allocator(&local_181);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_180,puVar3,
               puVar4 + lVar1,&local_181);
    std::allocator<unsigned_char>::~allocator(&local_181);
    local_168 = &local_180;
    Address::Set(&local_1b0,(Address *)&value,local_168);
    aError = Error::operator=(__return_storage_ptr__,&local_1b0);
    local_1b4 = kNone;
    bVar2 = commissioner::operator!=(aError,&local_1b4);
    Error::~Error(&local_1b0);
    this = aBuf_local;
    if (bVar2) {
      local_1dc = 6;
    }
    else {
      Address::ToString_abi_cxx11_(&local_1d8,(Address *)&value);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 &local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      local_d8 = local_d8 + 0x10;
      local_1dc = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_180);
    Address::~Address((Address *)&value);
  } while (local_1dc == 0);
  if (local_1dc == 6) {
LAB_0027ef7d:
    length._7_1_ = 1;
  }
  if ((length._7_1_ & 1) == 0) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeIpv6AddressList(std::vector<std::string> &aAddrs, const ByteArray &aBuf)
{
    Error  error;
    size_t length = aBuf.size();
    size_t offset = 0;
    while (offset < length)
    {
        VerifyOrExit(offset + kIpv6AddressBytes <= length, error = ERROR_BAD_FORMAT("premature end of IPv6 Address"));
        Address          addr;
        const ByteArray &value = {aBuf.data() + offset, aBuf.data() + offset + kIpv6AddressBytes};
        SuccessOrExit(error = addr.Set(value));
        aAddrs.emplace_back(addr.ToString());
        offset += kIpv6AddressBytes;
    }

exit:
    return error;
}